

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.hpp
# Opt level: O2

void __thiscall History::set_last_cmd(History *this,string *sess_id,string *cwd,string *cmd)

{
  int iVar1;
  socklen_t __len;
  Query query;
  Query QStack_58;
  
  __len = (socklen_t)cmd;
  sqlite::Query::Query(&QStack_58,&this->db,&(this->lcSch).insertOrReplace);
  iVar1 = (int)this;
  sqlite::Query::bind(&QStack_58,iVar1 + 0x50,(sockaddr *)sess_id,__len);
  sqlite::Query::bind(&QStack_58,iVar1 + 0xe0,(sockaddr *)cwd,__len);
  sqlite::Query::bind(&QStack_58,iVar1 + 0x170,(sockaddr *)cmd,__len);
  sqlite::Query::exec(&QStack_58);
  std::unique_ptr<sqlite3_stmt,_std::function<void_(sqlite3_stmt_*)>_>::~unique_ptr(&QStack_58.stmt)
  ;
  return;
}

Assistant:

void set_last_cmd(const std::string& sess_id, const std::string& cwd,
                    const std::string& cmd) {
    sqlite::Query query(db, lcSch.insertOrReplace);

    query.bind(lcSch.sess_id.bName,
               sess_id);  // TODO(dkolmakov): Implement type safe binding
    query.bind(lcSch.pwd.bName, cwd);
    query.bind(lcSch.cmd.bName, cmd);
    query.exec();
  }